

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

AST * jsonnet::internal::jsonnet_parse(Allocator *alloc,Tokens *tokens)

{
  AST *pAVar1;
  reference pvVar2;
  string *msg;
  list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *this;
  Tokens *in_RSI;
  Allocator *in_RDI;
  stringstream ss;
  AST *expr;
  Parser parser;
  list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
  *in_stack_fffffffffffffe00;
  Token *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 uVar3;
  StaticError *in_stack_fffffffffffffe20;
  stringstream local_1b0 [16];
  ostream local_1a0 [4];
  uint in_stack_fffffffffffffe64;
  Parser *in_stack_fffffffffffffe68;
  Parser local_20 [2];
  
  anon_unknown_0::Parser::Parser(local_20,in_RSI,in_RDI);
  pAVar1 = anon_unknown_0::Parser::parse(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  pvVar2 = std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
           front(in_stack_fffffffffffffe00);
  if (pvVar2->kind != END_OF_FILE) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    msg = (string *)std::operator<<(local_1a0,"did not expect: ");
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::front
              (in_stack_fffffffffffffe00);
    operator<<((ostream *)msg,in_stack_fffffffffffffe08);
    uVar3 = 1;
    this = (list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
           __cxa_allocate_exception(0x60);
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::front
              (this);
    std::__cxx11::stringstream::str();
    StaticError::StaticError
              (in_stack_fffffffffffffe20,(LocationRange *)CONCAT17(uVar3,in_stack_fffffffffffffe18),
               msg);
    __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
  }
  return pAVar1;
}

Assistant:

AST *jsonnet_parse(Allocator *alloc, Tokens &tokens)
{
    Parser parser(tokens, alloc);
    AST *expr = parser.parse(MAX_PRECEDENCE);
    if (tokens.front().kind != Token::END_OF_FILE) {
        std::stringstream ss;
        ss << "did not expect: " << tokens.front();
        throw StaticError(tokens.front().location, ss.str());
    }

    return expr;
}